

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodesWalk.h
# Opt level: O2

void __thiscall
dg::legacy::NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>::enqueue
          (NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_> *this,LLVMNode *n)

{
  LLVMNode *local_8;
  
  if ((n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).analysisAuxData.
      lastwalkid != this->run_id) {
    (n->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).analysisAuxData.lastwalkid
         = this->run_id;
    local_8 = n;
    std::deque<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::push_back
              ((deque<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)&this->queue,&local_8);
  }
  return;
}

Assistant:

void enqueue(NodeT *n) {
        AnalysesAuxiliaryData &aad = this->getAnalysisData(n);

        if (aad.lastwalkid == run_id)
            return;

        // mark node as visited
        aad.lastwalkid = run_id;
        queue.push(n);
    }